

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O2

void nhdp_domain_recalculate_mpr(void)

{
  nhdp_domain *domain;
  list_entity *plVar1;
  list_entity *plVar2;
  long lVar3;
  list_entity *plVar4;
  list_entity *plVar5;
  
  plVar5 = &_domain_list;
  while (plVar5 = plVar5->next, plVar5->prev != _domain_list.prev) {
    if (*(char *)&plVar5[-0x27].prev == '\x01') {
      if ((plVar5[-0x28].prev)->prev != (list_entity *)0x0) {
        domain = (nhdp_domain *)(plVar5 + -0x2a);
        plVar1 = nhdp_db_get_neigh_list();
        while( true ) {
          plVar1 = plVar1->next;
          plVar4 = plVar1->prev;
          plVar2 = nhdp_db_get_neigh_list();
          if (plVar4 == plVar2->prev) break;
          lVar3 = (long)*(int *)((long)&plVar5[-0x27].next + 4);
          *(undefined1 *)((long)&plVar1[lVar3 * 2 + 6].next + 2) =
               *(undefined1 *)((long)&plVar1[lVar3 * 2 + 6].next + 1);
        }
        (*(code *)(plVar5[-0x28].prev)->prev)(domain);
        plVar1 = nhdp_db_get_neigh_list();
        do {
          plVar1 = plVar1->next;
          plVar4 = plVar1->prev;
          plVar2 = nhdp_db_get_neigh_list();
          if (plVar4 == plVar2->prev) goto LAB_001286bf;
          lVar3 = (long)*(int *)((long)&plVar5[-0x27].next + 4);
        } while (*(char *)((long)&plVar1[lVar3 * 2 + 6].next + 2) ==
                 *(char *)((long)&plVar1[lVar3 * 2 + 6].next + 1));
        if (((&log_global_mask)[LOG_NHDP] & 1) != 0) {
          oonf_log(1,(ulong)LOG_NHDP,"src/nhdp/nhdp/nhdp_domain.c",1000,0,0,
                   "Domain ext %u MPR set changed");
        }
        (*(code *)(plVar5[-0x28].prev)->prev)(domain);
        _fire_mpr_changed(domain);
      }
LAB_001286bf:
      *(undefined1 *)&plVar5[-0x27].prev = 0;
    }
  }
  if (_flooding_domain._mpr_outdated == true) {
    plVar5 = nhdp_db_get_link_list();
    while( true ) {
      plVar5 = plVar5->next;
      plVar1 = plVar5->prev;
      plVar4 = nhdp_db_get_link_list();
      if (plVar1 == plVar4->prev) break;
      *(undefined1 *)((long)&plVar5[-6].prev + 3) = *(undefined1 *)((long)&plVar5[-6].prev + 1);
    }
    (*(_flooding_domain.mpr)->update_flooding_mpr)(&_flooding_domain);
    plVar5 = nhdp_db_get_link_list();
    do {
      plVar5 = plVar5->next;
      plVar1 = plVar5->prev;
      plVar4 = nhdp_db_get_link_list();
      if (plVar1 == plVar4->prev) goto LAB_0012878c;
    } while (*(char *)((long)&plVar5[-6].prev + 3) == *(char *)((long)&plVar5[-6].prev + 1));
    if (((&log_global_mask)[LOG_NHDP] & 1) != 0) {
      oonf_log(1,(ulong)LOG_NHDP,"src/nhdp/nhdp/nhdp_domain.c",0x3c6,0,0,
               "Flooding domain MPR set changed");
    }
    (*(_flooding_domain.mpr)->update_flooding_mpr)(&_flooding_domain);
    _fire_mpr_changed(&_flooding_domain);
LAB_0012878c:
    _flooding_domain._mpr_outdated = false;
  }
  return;
}

Assistant:

void
nhdp_domain_recalculate_mpr(void) {
  struct nhdp_domain *domain;

  list_for_each_element(&_domain_list, domain, _node) {
    if (domain->_mpr_outdated) {
      if (_recalculate_routing_mpr_set(domain)) {
        domain->mpr->update_routing_mpr(domain);
        _fire_mpr_changed(domain);
      }
      domain->_mpr_outdated = false;
    }
  }
  if (_flooding_domain._mpr_outdated) {
    if (_recalculate_flooding_mpr_set()) {
      _flooding_domain.mpr->update_flooding_mpr(&_flooding_domain);
      _fire_mpr_changed(&_flooding_domain);
    }
    _flooding_domain._mpr_outdated = false;
  }
}